

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketTest2.cpp
# Opt level: O0

void __thiscall TcpSocketTest::test1(TcpSocketTest *this)

{
  undefined1 local_500 [8];
  timespec tt;
  timespec t;
  undefined1 auStack_4d8 [4];
  int i;
  char buf [128];
  int res;
  Address client_addr;
  Address server_addr2;
  Address server_addr;
  ServerSocket server2;
  ServerSocket server;
  Socket local_2f8 [8];
  Socket sock;
  Selector local_288 [8];
  Selector s;
  TcpSocketTest *this_local;
  
  this->no_echo = true;
  Selector::Selector(local_288,"TcpSelector");
  JetHead::Socket::Socket(local_2f8,true);
  JetHead::ServerSocket::ServerSocket((ServerSocket *)&stack0xfffffffffffffc88,true);
  JetHead::ServerSocket::ServerSocket((ServerSocket *)(server_addr.mName + 8),true);
  JetHead::Socket::Address::Address((Address *)(server_addr2.mName + 8));
  JetHead::Socket::Address::Address((Address *)(client_addr.mName + 8));
  JetHead::Socket::Address::Address((Address *)(buf + 0x7c));
  for (t.tv_nsec._4_4_ = 0; t.tv_nsec._4_4_ < 0x80; t.tv_nsec._4_4_ = t.tv_nsec._4_4_ + 1) {
    auStack_4d8[t.tv_nsec._4_4_] = 0x41;
  }
  buf._120_4_ = JetHead::ServerSocket::bind((Address *)&stack0xfffffffffffffc88);
  if (buf._120_4_ == -1) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest2.cpp"
               ,0x180,"Bind Failed.");
  }
  buf._120_4_ = JetHead::ServerSocket::listen((int)&stack0xfffffffffffffc88);
  if ((int)buf._120_4_ < 0) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest2.cpp"
               ,0x188,"ListenFailed");
  }
  buf._120_4_ = JetHead::Socket::getLocalAddress((Address *)&stack0xfffffffffffffc88);
  JetHead::Socket::Address::setAddress(server_addr2.mName + 8);
  JetHead::Socket::setSelector
            ((SocketListener *)&stack0xfffffffffffffc88,(Selector *)&this->super_SocketListener);
  tt.tv_sec = 0;
  local_500 = (undefined1  [8])0x0;
  tt.tv_nsec = 0;
  buf._120_4_ = nanosleep((timespec *)&tt.tv_nsec,(timespec *)local_500);
  this->no_echo = false;
  JetHead::Socket::Address::~Address((Address *)(buf + 0x7c));
  JetHead::Socket::Address::~Address((Address *)(client_addr.mName + 8));
  JetHead::Socket::Address::~Address((Address *)(server_addr2.mName + 8));
  JetHead::ServerSocket::~ServerSocket((ServerSocket *)(server_addr.mName + 8));
  JetHead::ServerSocket::~ServerSocket((ServerSocket *)&stack0xfffffffffffffc88);
  JetHead::Socket::~Socket(local_2f8);
  Selector::~Selector(local_288);
  return;
}

Assistant:

void TcpSocketTest::test1()
{

  no_echo = true;
  Selector s( "TcpSelector" );
  Socket sock;
  ServerSocket server;
  ServerSocket server2;
  Socket::Address server_addr, server_addr2, client_addr;
  int res;
  char buf[BUF_SIZE];
  for( int i = 0; i < BUF_SIZE; i++)
    buf[i] = 'A';
  
  
  
  // This crashes the program. 
  // res = server.write(buf, BUF_SIZE);
  //if( res != -1 )
  //TestFailed("Writing no where should fail");
  
  
  
  res = server.bind(server_addr);
  if( res == -1 )
    TestFailed("Bind Failed.");
  
  // res = server.write(buf, BUF_SIZE);
  //if( res != -1 )
  //TestFailed("Writing no where should fail");
  
  res = server.listen(1);
  if ( res < 0 )
    TestFailed("ListenFailed");
  
  //res = server.write(buf, BUF_SIZE);
  //if( res != -1 )
  //  TestFailed("Writing no where should fail");
  
  res = server.getLocalAddress( server_addr );
  server_addr.setAddress( "127.0.0.1" );
  
  // UNCOMMENT TO PALY ECHO cerr << "Server name " <<  server_addr.getName() << " "<<  server_addr.getPort() << endl;
  
  server.setSelector( this, mSelector );

  //res = sock.connect( server_addr );
  //cout << "In echo mode." << endl;
  
  struct timespec t,tt;
  t.tv_sec = tt.tv_sec = tt.tv_nsec = 0;
  t.tv_nsec = 10000000;
  res = nanosleep( &t, &tt );
 
  
  
  no_echo = false;
  //cout << "Out of echo mode." << endl;

    
}